

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::flip32(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  badface **fstack;
  tetrahedron ppdVar1;
  tetrahedron p3;
  tetgenmesh *p0;
  memorypool *pmVar2;
  double *pdVar3;
  tetgenio *ptVar4;
  bool bVar5;
  bool bVar6;
  tetrahedron p3_00;
  shellface *pppdVar7;
  uint uVar8;
  bool bVar9;
  int i;
  int iVar10;
  long lVar11;
  tetrahedron *pppdVar12;
  tetrahedron ppdVar13;
  long lVar14;
  ulong *puVar15;
  void *pvVar16;
  undefined4 *puVar17;
  uint uVar18;
  int iVar19;
  tetrahedron *pppdVar20;
  ulong uVar21;
  tetrahedron *pppdVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  tetgenmesh *ptVar26;
  bool bVar27;
  undefined8 in_R11;
  undefined7 uVar28;
  ulong uVar29;
  int iVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  face flipshs [3];
  char local_168;
  triface local_140;
  tetrahedron local_130;
  tetrahedron local_128;
  undefined8 uStack_120;
  tetrahedron *local_118;
  uint local_110 [8];
  ulong uStack_f0;
  ulong uStack_e8;
  uint local_e0 [12];
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  ulong local_90;
  ulong uStack_88;
  ulong auStack_80 [5];
  face local_58;
  ulong local_48;
  uint local_40;
  
  lVar11 = 8;
  do {
    *(undefined8 *)((long)&uStack_f0 + lVar11) = 0;
    *(undefined4 *)((long)local_e0 + lVar11 + -8) = 0;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x38);
  lVar11 = 8;
  do {
    *(undefined8 *)((long)&uStack_120 + lVar11) = 0;
    *(undefined4 *)((long)local_110 + lVar11 + -8) = 0;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x38);
  local_140.tet = (tetrahedron *)0x0;
  local_140.ver = 0;
  lVar11 = 8;
  do {
    *(undefined8 *)((long)&local_90 + lVar11) = 0;
    *(undefined4 *)((long)auStack_80 + lVar11 + -8) = 0;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x38);
  pppdVar22 = fliptets->tet;
  pppdVar12 = pppdVar22;
  if (hullflag < 1) {
    pppdVar20 = fliptets[1].tet;
    iVar10 = fliptets[1].ver;
LAB_0011d601:
    uStack_120._4_4_ = 0;
LAB_0011d60c:
    bVar5 = false;
    bVar6 = false;
  }
  else {
    iVar19 = fliptets->ver;
    ppdVar1 = (tetrahedron)this->dummypoint;
    uVar28 = (undefined7)((ulong)in_R11 >> 8);
    if (pppdVar22[orgpivot[iVar19]] == ppdVar1) {
      lVar11 = 8;
      do {
        *(int *)((long)&fliptets->tet + lVar11) = esymtbl[*(int *)((long)&fliptets->tet + lVar11)];
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x38);
      local_140.tet = fliptets[1].tet;
      local_140.ver = fliptets[1].ver;
      pppdVar20 = fliptets[2].tet;
      fliptets[1].tet = pppdVar20;
      iVar10 = fliptets[2].ver;
      fliptets[1].ver = iVar10;
      fliptets[2].tet = local_140.tet;
      fliptets[2].ver = local_140.ver;
      uStack_120._4_4_ = (undefined4)CONCAT71(uVar28,1);
      bVar6 = false;
      bVar5 = true;
    }
    else {
      if (pppdVar22[apexpivot[iVar19]] != ppdVar1) {
        pppdVar20 = fliptets[1].tet;
        iVar10 = fliptets[1].ver;
        if (pppdVar20[apexpivot[iVar10]] != ppdVar1) goto LAB_0011d601;
        pppdVar12 = fliptets[2].tet;
        fliptets->tet = pppdVar12;
        fliptets->ver = fliptets[2].ver;
        fliptets[2].tet = pppdVar20;
        fliptets[2].ver = iVar10;
        fliptets[1].tet = pppdVar22;
        fliptets[1].ver = iVar19;
        uStack_120._4_4_ = (undefined4)CONCAT71(uVar28,1);
        pppdVar20 = pppdVar22;
        iVar10 = iVar19;
        local_140.tet = pppdVar22;
        local_140.ver = iVar19;
        goto LAB_0011d60c;
      }
      pppdVar12 = fliptets[1].tet;
      fliptets->tet = pppdVar12;
      fliptets->ver = fliptets[1].ver;
      pppdVar20 = fliptets[2].tet;
      fliptets[1].tet = pppdVar20;
      iVar10 = fliptets[2].ver;
      fliptets[1].ver = iVar10;
      fliptets[2].tet = pppdVar22;
      fliptets[2].ver = iVar19;
      uStack_120._4_4_ = (undefined4)CONCAT71(uVar28,1);
      bVar5 = false;
      bVar6 = true;
      local_140.tet = pppdVar22;
      local_140.ver = iVar19;
    }
  }
  iVar19 = fliptets->ver;
  ppdVar1 = pppdVar12[apexpivot[iVar19]];
  p3 = pppdVar20[apexpivot[iVar10]];
  local_128 = fliptets[2].tet[apexpivot[fliptets[2].ver]];
  local_130 = pppdVar12[destpivot[iVar19]];
  p0 = (tetgenmesh *)pppdVar12[orgpivot[iVar19]];
  this->flip32count = this->flip32count + 1;
  lVar11 = 8;
  do {
    uVar25 = eorgoppotbl[*(int *)((long)&fliptets->tet + lVar11)];
    uVar21 = *(ulong *)(*(long *)((long)fliptets + lVar11 + -8) + (ulong)(uVar25 & 3) * 8);
    *(ulong *)((long)&uStack_f0 + lVar11) = uVar21 & 0xfffffffffffffff0;
    *(int *)((long)local_e0 + lVar11 + -8) = fsymtbl[(int)uVar25][(uint)uVar21 & 0xf];
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x38);
  lVar11 = 8;
  do {
    uVar25 = edestoppotbl[*(int *)((long)&fliptets->tet + lVar11)];
    uVar21 = *(ulong *)(*(long *)((long)fliptets + lVar11 + -8) + (ulong)(uVar25 & 3) * 8);
    *(ulong *)((long)&uStack_120 + lVar11) = uVar21 & 0xfffffffffffffff0;
    *(int *)((long)local_110 + lVar11 + -8) = fsymtbl[(int)uVar25][(uint)uVar21 & 0xf];
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x38);
  uVar25 = 0;
  if (this->checksubfaceflag == 0) {
    local_90 = 0xffffffff;
  }
  else {
    local_90 = 0xffffffff;
    lVar11 = 0;
    uVar21 = 0;
    do {
      lVar14 = *(long *)(*(long *)((long)&fliptets->tet + lVar11) + 0x48);
      if (lVar14 == 0) {
        *(undefined8 *)((long)auStack_80 + lVar11 + -8) = 0;
LAB_0011d850:
        local_90 = uVar21 & 0xffffffff;
      }
      else {
        uVar18 = *(uint *)((long)&fliptets->ver + lVar11);
        uVar23 = *(ulong *)(lVar14 + (ulong)(uVar18 & 3) * 8);
        *(int *)((long)auStack_80 + lVar11) = tspivottbl[(int)uVar18][(uint)uVar23 & 7];
        uVar23 = uVar23 & 0xfffffffffffffff8;
        *(ulong *)((long)auStack_80 + lVar11 + -8) = uVar23;
        if (uVar23 == 0) goto LAB_0011d850;
        uVar25 = uVar25 + 1;
        *(undefined8 *)(uVar23 + 0x48) = 0;
        *(undefined8 *)(uVar23 + 0x50) = 0;
      }
      uVar21 = uVar21 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar21 != 3);
    pppdVar12 = fliptets->tet;
    pppdVar20 = fliptets[1].tet;
    uVar25 = (uint)(0 < (int)uVar25);
  }
  local_168 = (char)uVar25;
  fliptets->ver = 0xb;
  fliptets[1].ver = 0xb;
  *(undefined4 *)((long)pppdVar12 + (long)this->elemmarkerindex * 4) = 0;
  *(undefined4 *)((long)pppdVar20 + (long)this->elemmarkerindex * 4) = 0;
  if (this->checksubsegflag != 0) {
    ppdVar13 = pppdVar12[8];
    if (ppdVar13 != (tetrahedron)0x0) {
      pmVar2 = this->tet2segpool;
      *ppdVar13 = (double *)pmVar2->deaditemstack;
      pmVar2->deaditemstack = ppdVar13;
      pmVar2->items = pmVar2->items + -1;
      fliptets->tet[8] = (tetrahedron)0x0;
      pppdVar20 = fliptets[1].tet;
    }
    ppdVar13 = pppdVar20[8];
    if (ppdVar13 != (tetrahedron)0x0) {
      pmVar2 = this->tet2segpool;
      *ppdVar13 = (double *)pmVar2->deaditemstack;
      pmVar2->deaditemstack = ppdVar13;
      pmVar2->items = pmVar2->items + -1;
      fliptets[1].tet[8] = (tetrahedron)0x0;
    }
  }
  if (this->checksubfaceflag != 0) {
    ppdVar13 = fliptets->tet[9];
    if (ppdVar13 != (tetrahedron)0x0) {
      pmVar2 = this->tet2subpool;
      *ppdVar13 = (double *)pmVar2->deaditemstack;
      pmVar2->deaditemstack = ppdVar13;
      pmVar2->items = pmVar2->items + -1;
      fliptets->tet[9] = (tetrahedron)0x0;
    }
    ppdVar13 = fliptets[1].tet[9];
    if (ppdVar13 != (tetrahedron)0x0) {
      pmVar2 = this->tet2subpool;
      *ppdVar13 = (double *)pmVar2->deaditemstack;
      pmVar2->deaditemstack = ppdVar13;
      pmVar2->items = pmVar2->items + -1;
      fliptets[1].tet[9] = (tetrahedron)0x0;
    }
    if (local_168 == '\0') {
      local_168 = '\0';
    }
    else {
      uVar25 = this->numelemattrib;
      iVar10 = this->b->varvolume;
      iVar19 = this->elemattribindex;
      iVar30 = this->volumeboundindex;
      lVar11 = 0;
      bVar9 = true;
      do {
        bVar27 = bVar9;
        if (0 < (int)uVar25) {
          pppdVar22 = fliptets[(int)local_90].tet;
          pppdVar12 = fliptets[lVar11].tet;
          uVar21 = 0;
          do {
            pppdVar12[(long)iVar19 + uVar21] = pppdVar22[(long)iVar19 + uVar21];
            uVar21 = uVar21 + 1;
          } while (uVar25 != uVar21);
        }
        if (iVar10 != 0) {
          fliptets[lVar11].tet[iVar30] = fliptets[(int)local_90].tet[iVar30];
        }
        lVar11 = 1;
        bVar9 = false;
      } while (bVar27);
      local_168 = '\x01';
    }
  }
  tetrahedrondealloc(this,fliptets[2].tet);
  p3_00 = local_128;
  ppdVar13 = local_130;
  ptVar26 = p0;
  if (hullflag < 1) {
    uVar21 = (ulong)fliptets->ver;
    fliptets->tet[orgpivot[uVar21]] = ppdVar1;
    fliptets->tet[destpivot[uVar21]] = p3;
    fliptets->tet[apexpivot[uVar21]] = local_128;
    fliptets->tet[oppopivot[uVar21]] = local_130;
    uVar23 = (ulong)fliptets[1].ver;
    fliptets[1].tet[orgpivot[uVar23]] = p3;
    fliptets[1].tet[destpivot[uVar23]] = ppdVar1;
    fliptets[1].tet[apexpivot[uVar23]] = local_128;
    fliptets[1].tet[oppopivot[uVar23]] = (tetrahedron)p0;
  }
  else if (local_128 == (tetrahedron)this->dummypoint) {
    iVar10 = fliptets->ver;
    fliptets->tet[orgpivot[iVar10]] = p3;
    fliptets->tet[destpivot[iVar10]] = ppdVar1;
    fliptets->tet[apexpivot[iVar10]] = local_130;
    fliptets->tet[oppopivot[iVar10]] = local_128;
    iVar19 = fliptets[1].ver;
    fliptets[1].tet[orgpivot[iVar19]] = ppdVar1;
    fliptets[1].tet[destpivot[iVar19]] = p3;
    iVar30 = apexpivot[iVar19];
    fliptets[1].tet[iVar30] = (tetrahedron)p0;
    fliptets[1].tet[oppopivot[iVar19]] = local_128;
    uVar21 = (ulong)(uint)esymtbl[iVar10];
    fliptets->ver = esymtbl[iVar10];
    uVar23 = (ulong)(uint)esymtbl[iVar19];
    fliptets[1].ver = esymtbl[iVar19];
    ptVar26 = (tetgenmesh *)(long)iVar30;
  }
  else {
    if (local_130 == (tetrahedron)this->dummypoint) {
      this->hullsize = this->hullsize + -2;
    }
    uVar21 = (ulong)fliptets->ver;
    fliptets->tet[orgpivot[uVar21]] = ppdVar1;
    fliptets->tet[destpivot[uVar21]] = p3;
    fliptets->tet[apexpivot[uVar21]] = local_128;
    fliptets->tet[oppopivot[uVar21]] = local_130;
    uVar23 = (ulong)fliptets[1].ver;
    fliptets[1].tet[orgpivot[uVar23]] = p3;
    fliptets[1].tet[destpivot[uVar23]] = ppdVar1;
    fliptets[1].tet[apexpivot[uVar23]] = local_128;
    fliptets[1].tet[oppopivot[uVar23]] = (tetrahedron)p0;
  }
  if (fc->remove_ndelaunay_edge != 0) {
    if (local_128 == (tetrahedron)this->dummypoint) {
      dVar32 = tetprismvol(ptVar26,(double *)p0,(double *)local_130,(double *)ppdVar1,(double *)p3);
      dVar31 = 0.0;
LAB_0011dd5b:
      dVar34 = 0.0;
      dVar33 = 0.0;
      dVar35 = 0.0;
    }
    else {
      if (local_130 == (tetrahedron)this->dummypoint) {
        dVar31 = tetprismvol(ptVar26,(double *)p3,(double *)ppdVar1,(double *)local_128,(double *)p0
                            );
        dVar32 = 0.0;
        goto LAB_0011dd5b;
      }
      local_98 = tetprismvol(ptVar26,(double *)p0,(double *)local_130,(double *)ppdVar1,(double *)p3
                            );
      local_a0 = tetprismvol(ptVar26,(double *)p0,(double *)ppdVar13,(double *)p3,(double *)p3_00);
      local_a8 = tetprismvol(ptVar26,(double *)p0,(double *)ppdVar13,(double *)p3_00,
                             (double *)ppdVar1);
      local_b0 = tetprismvol(ptVar26,(double *)ppdVar1,(double *)p3,(double *)p3_00,
                             (double *)ppdVar13);
      dVar31 = tetprismvol(ptVar26,(double *)p3,(double *)ppdVar1,(double *)p3_00,(double *)p0);
      dVar32 = local_98;
      dVar33 = local_a0;
      dVar34 = local_a8;
      dVar35 = local_b0;
    }
    fc->tetprism_vol_sum = ((((dVar31 + dVar35) - dVar32) - dVar33) - dVar34) + fc->tetprism_vol_sum
    ;
    uVar21 = (ulong)(uint)fliptets->ver;
    uVar23 = (ulong)(uint)fliptets[1].ver;
  }
  uVar25 = (uint)uVar21;
  uVar18 = (uint)uVar23;
  fliptets->tet[uVar25 & 3] =
       (tetrahedron)((long)bondtbl[(int)uVar25][(int)uVar18] | (ulong)fliptets[1].tet);
  fliptets[1].tet[uVar18 & 3] =
       (tetrahedron)((long)bondtbl[(int)uVar18][(int)uVar25] | (ulong)fliptets->tet);
  lVar11 = 8;
  do {
    pppdVar22 = fliptets->tet;
    iVar10 = (int)uVar21;
    uVar25 = esymtbl[iVar10];
    uVar21 = *(ulong *)((long)&uStack_f0 + lVar11);
    uVar18 = *(uint *)((long)local_e0 + lVar11 + -8);
    pppdVar22[uVar25 & 3] = (tetrahedron)((long)bondtbl[(int)uVar25][(int)uVar18] | uVar21);
    *(ulong *)(uVar21 + (ulong)(uVar18 & 3) * 8) =
         (long)bondtbl[(int)uVar18][(int)uVar25] | (ulong)pppdVar22;
    uVar21 = (ulong)(uint)enexttbl[iVar10];
    fliptets->ver = enexttbl[iVar10];
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x38);
  lVar11 = 8;
  do {
    pppdVar22 = fliptets[1].tet;
    iVar10 = (int)uVar23;
    local_140.ver = esymtbl[iVar10];
    uVar29 = (ulong)local_140.ver;
    uVar23 = *(ulong *)((long)&uStack_120 + lVar11);
    uVar25 = *(uint *)((long)local_110 + lVar11 + -8);
    pppdVar22[local_140.ver & 3] = (tetrahedron)((long)bondtbl[uVar29][(int)uVar25] | uVar23);
    *(ulong *)(uVar23 + (ulong)(uVar25 & 3) * 8) =
         (long)bondtbl[(int)uVar25][uVar29] | (ulong)pppdVar22;
    uVar23 = (ulong)(uint)eprevtbl[iVar10];
    fliptets[1].ver = eprevtbl[iVar10];
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x38);
  uVar25 = local_140.ver;
  if (this->checksubsegflag != 0) {
    lVar11 = 0;
    local_140.tet = pppdVar22;
    do {
      iVar19 = (int)uVar23;
      iVar10 = (int)uVar21;
      if ((*(long *)(*(long *)(local_e0 + lVar11 * 4 + -2) + 0x40) != 0) &&
         (pdVar3 = *(double **)
                    (*(long *)(*(long *)(local_e0 + lVar11 * 4 + -2) + 0x40) +
                    (long)ver2edge[(int)local_e0[lVar11 * 4]] * 8), pdVar3 != (double *)0x0)) {
        ppdVar13 = fliptets->tet[8];
        if (ppdVar13 == (tetrahedron)0x0) {
          ppdVar13 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          fliptets->tet[8] = ppdVar13;
          lVar14 = 0;
          do {
            fliptets->tet[8][lVar14] = (double *)0x0;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 6);
          ppdVar13 = fliptets->tet[8];
          iVar10 = fliptets->ver;
        }
        uVar21 = (ulong)pdVar3 & 0xfffffffffffffff8;
        ppdVar13[ver2edge[iVar10]] = pdVar3;
        *(ulong *)(uVar21 + 0x48) = (long)iVar10 | (ulong)fliptets->tet;
        ppdVar13 = fliptets[1].tet[8];
        if (ppdVar13 == (tetrahedron)0x0) {
          ppdVar13 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          fliptets[1].tet[8] = ppdVar13;
          lVar14 = 0;
          do {
            fliptets[1].tet[8][lVar14] = (double *)0x0;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 6);
          ppdVar13 = fliptets[1].tet[8];
        }
        iVar19 = fliptets[1].ver;
        ppdVar13[ver2edge[iVar19]] = pdVar3;
        *(ulong *)(uVar21 + 0x48) = (long)iVar19 | (ulong)fliptets[1].tet;
        if ((fc->chkencflag & 1) != 0) {
          uVar25 = *(uint *)(uVar21 + 4 + (long)this->shmarkindex * 4);
          if ((uVar25 & 4) == 0) {
            pmVar2 = this->badsubsegs;
            *(uint *)(uVar21 + 4 + (long)this->shmarkindex * 4) = uVar25 | 4;
            puVar15 = (ulong *)memorypool::alloc(pmVar2);
            *puVar15 = uVar21;
            *(uint *)(puVar15 + 1) = (uint)pdVar3 & 7;
            iVar19 = fliptets[1].ver;
          }
        }
      }
      uVar21 = (ulong)(uint)enexttbl[fliptets->ver];
      fliptets->ver = enexttbl[fliptets->ver];
      uVar23 = (ulong)(uint)eprevtbl[iVar19];
      fliptets[1].ver = eprevtbl[iVar19];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar11 = 0;
    do {
      if ((*(long *)(*(long *)(local_e0 + lVar11 * 4 + -2) + 0x40) != 0) &&
         (pdVar3 = *(double **)
                    (*(long *)(*(long *)(local_e0 + lVar11 * 4 + -2) + 0x40) +
                    (long)ver2edge[enexttbl[(int)local_e0[lVar11 * 4]]] * 8),
         pdVar3 != (double *)0x0)) {
        pppdVar22 = fliptets->tet;
        iVar10 = eprevtbl[esymtbl[(int)uVar21]];
        ppdVar13 = pppdVar22[8];
        if (ppdVar13 == (tetrahedron)0x0) {
          ppdVar13 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar22[8] = ppdVar13;
          lVar14 = 0;
          do {
            pppdVar22[8][lVar14] = (double *)0x0;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 6);
          ppdVar13 = pppdVar22[8];
        }
        uVar21 = (ulong)pdVar3 & 0xfffffffffffffff8;
        ppdVar13[ver2edge[iVar10]] = pdVar3;
        *(ulong *)(uVar21 + 0x48) = (ulong)pppdVar22 | (long)iVar10;
        if ((fc->chkencflag & 1) != 0) {
          uVar25 = *(uint *)(uVar21 + 4 + (long)this->shmarkindex * 4);
          if ((uVar25 & 4) == 0) {
            pmVar2 = this->badsubsegs;
            *(uint *)(uVar21 + 4 + (long)this->shmarkindex * 4) = uVar25 | 4;
            puVar15 = (ulong *)memorypool::alloc(pmVar2);
            *puVar15 = uVar21;
            *(uint *)(puVar15 + 1) = (uint)pdVar3 & 7;
          }
        }
      }
      uVar21 = (ulong)(uint)enexttbl[fliptets->ver];
      fliptets->ver = enexttbl[fliptets->ver];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    iVar10 = fliptets[1].ver;
    lVar11 = 0;
    do {
      pppdVar22 = fliptets[1].tet;
      uVar25 = enexttbl[esymtbl[iVar10]];
      uVar29 = (ulong)uVar25;
      if ((*(long *)(*(long *)(local_110 + lVar11 * 4 + -2) + 0x40) != 0) &&
         (pdVar3 = *(double **)
                    (*(long *)(*(long *)(local_110 + lVar11 * 4 + -2) + 0x40) +
                    (long)ver2edge[eprevtbl[(int)local_110[lVar11 * 4]]] * 8),
         pdVar3 != (double *)0x0)) {
        ppdVar13 = pppdVar22[8];
        if (ppdVar13 == (tetrahedron)0x0) {
          ppdVar13 = (tetrahedron)memorypool::alloc(this->tet2segpool);
          pppdVar22[8] = ppdVar13;
          lVar14 = 0;
          do {
            pppdVar22[8][lVar14] = (double *)0x0;
            lVar14 = lVar14 + 1;
          } while (lVar14 != 6);
          ppdVar13 = pppdVar22[8];
        }
        uVar21 = (ulong)pdVar3 & 0xfffffffffffffff8;
        ppdVar13[ver2edge[(int)uVar25]] = pdVar3;
        *(ulong *)(uVar21 + 0x48) = (long)(int)uVar25 | (ulong)pppdVar22;
        if ((fc->chkencflag & 1) != 0) {
          uVar18 = *(uint *)(uVar21 + 4 + (long)this->shmarkindex * 4);
          if ((uVar18 & 4) == 0) {
            pmVar2 = this->badsubsegs;
            *(uint *)(uVar21 + 4 + (long)this->shmarkindex * 4) = uVar18 | 4;
            puVar15 = (ulong *)memorypool::alloc(pmVar2);
            *puVar15 = uVar21;
            *(uint *)(puVar15 + 1) = (uint)pdVar3 & 7;
          }
        }
      }
      iVar10 = eprevtbl[fliptets[1].ver];
      fliptets[1].ver = iVar10;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
  }
  local_140.ver = uVar25;
  local_140.tet = pppdVar22;
  if (this->checksubfaceflag != 0) {
    lVar11 = 0;
    do {
      if (*(long *)(*(long *)(local_e0 + lVar11 * 4 + -2) + 0x48) != 0) {
        uVar21 = *(ulong *)(*(long *)(*(long *)(local_e0 + lVar11 * 4 + -2) + 0x48) +
                           (ulong)(local_e0[lVar11 * 4] & 3) * 8);
        if (uVar21 != 0) {
          iVar10 = tspivottbl[(int)local_e0[lVar11 * 4]][(uint)uVar21 & 7];
          pppdVar22 = fliptets->tet;
          uVar25 = esymtbl[fliptets->ver];
          uVar29 = (ulong)uVar25;
          ppdVar13 = pppdVar22[9];
          if (ppdVar13 == (tetrahedron)0x0) {
            ppdVar13 = (tetrahedron)memorypool::alloc(this->tet2subpool);
            pppdVar22[9] = ppdVar13;
            lVar14 = 0;
            do {
              pppdVar22[9][lVar14] = (double *)0x0;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 4);
            ppdVar13 = pppdVar22[9];
          }
          uVar21 = uVar21 & 0xfffffffffffffff8;
          uVar23 = (long)iVar10 ^ 1;
          ppdVar13[uVar25 & 3] = (double *)((long)tsbondtbl[(int)uVar25][uVar23] | uVar21);
          *(ulong *)(uVar21 + 0x48 + (ulong)((uint)uVar23 & 1) * 8) =
               (long)stbondtbl[(int)uVar25][uVar23] | (ulong)pppdVar22;
          if ((fc->chkencflag & 2) != 0) {
            uVar25 = *(uint *)(uVar21 + 4 + (long)this->shmarkindex * 4);
            if ((uVar25 & 4) == 0) {
              pmVar2 = this->badsubfacs;
              *(uint *)(uVar21 + 4 + (long)this->shmarkindex * 4) = uVar25 | 4;
              puVar15 = (ulong *)memorypool::alloc(pmVar2);
              *puVar15 = uVar21;
              *(uint *)(puVar15 + 1) = (uint)uVar23;
            }
          }
        }
      }
      fliptets->ver = enexttbl[fliptets->ver];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    lVar11 = 0;
    do {
      if (*(long *)(*(long *)(local_110 + lVar11 * 4 + -2) + 0x48) != 0) {
        uVar21 = *(ulong *)(*(long *)(*(long *)(local_110 + lVar11 * 4 + -2) + 0x48) +
                           (ulong)(local_110[lVar11 * 4] & 3) * 8);
        if (uVar21 != 0) {
          iVar10 = tspivottbl[(int)local_110[lVar11 * 4]][(uint)uVar21 & 7];
          pppdVar22 = fliptets[1].tet;
          uVar25 = esymtbl[fliptets[1].ver];
          uVar29 = (ulong)uVar25;
          ppdVar13 = pppdVar22[9];
          if (ppdVar13 == (tetrahedron)0x0) {
            ppdVar13 = (tetrahedron)memorypool::alloc(this->tet2subpool);
            pppdVar22[9] = ppdVar13;
            lVar14 = 0;
            do {
              pppdVar22[9][lVar14] = (double *)0x0;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 4);
            ppdVar13 = pppdVar22[9];
          }
          uVar21 = uVar21 & 0xfffffffffffffff8;
          uVar23 = (long)iVar10 ^ 1;
          ppdVar13[uVar25 & 3] = (double *)((long)tsbondtbl[(int)uVar25][uVar23] | uVar21);
          *(ulong *)(uVar21 + 0x48 + (ulong)((uint)uVar23 & 1) * 8) =
               (long)stbondtbl[(int)uVar25][uVar23] | (ulong)pppdVar22;
          if ((fc->chkencflag & 2) != 0) {
            uVar25 = *(uint *)(uVar21 + 4 + (long)this->shmarkindex * 4);
            if ((uVar25 & 4) == 0) {
              pmVar2 = this->badsubfacs;
              *(uint *)(uVar21 + 4 + (long)this->shmarkindex * 4) = uVar25 | 4;
              puVar15 = (ulong *)memorypool::alloc(pmVar2);
              *puVar15 = uVar21;
              *(uint *)(puVar15 + 1) = (uint)uVar23;
            }
          }
        }
      }
      fliptets[1].ver = eprevtbl[fliptets[1].ver];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    local_140.ver = (int)uVar29;
    local_140.tet = pppdVar22;
    if (local_168 == '\0') goto LAB_0011e9ca;
    iVar10 = (int)local_90;
    iVar30 = iVar10 + ((iVar10 + 1) / 3) * -3 + 1;
    local_58.sh = (shellface *)auStack_80[(long)iVar30 * 2 + -1];
    local_58.shver = (uint)auStack_80[(long)iVar30 * 2];
    lVar11 = (long)(((iVar10 + 2) / 3) * -3 + iVar10 + 2);
    local_48 = auStack_80[lVar11 * 2 + -1];
    local_40 = (uint)auStack_80[lVar11 * 2] ^ 1;
    flip22(this,&local_58,0,fc->chkencflag);
    iVar19 = local_58.shver;
    pppdVar22 = fliptets->tet;
    iVar10 = fliptets->ver;
    pppdVar12 = fliptets[1].tet;
    uVar25 = fliptets[1].ver;
    if (0 < iVar30) {
      do {
        iVar10 = enexttbl[iVar10];
        uVar25 = eprevtbl[(int)uVar25];
        iVar30 = iVar30 + -1;
      } while (iVar30 != 0);
    }
    uVar18 = esymtbl[iVar10];
    uVar21 = (ulong)local_58.shver;
    ppdVar13 = pppdVar22[9];
    local_118 = pppdVar12;
    local_110[0] = uVar25;
    if (ppdVar13 == (tetrahedron)0x0) {
      ppdVar13 = (tetrahedron)memorypool::alloc(this->tet2subpool);
      pppdVar22[9] = ppdVar13;
      lVar11 = 0;
      do {
        pppdVar22[9][lVar11] = (double *)0x0;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      ppdVar13 = pppdVar22[9];
    }
    else if ((double *)0x7 < ppdVar13[uVar18 & 3]) goto LAB_0011e86e;
    pppdVar7 = local_58.sh;
    uVar29 = uVar21 ^ 1;
    uVar23 = (ulong)((uVar18 & 3) << 3);
    *(ulong *)((long)ppdVar13 + uVar23) = (long)tsbondtbl[(int)uVar18][uVar29] | (ulong)local_58.sh;
    local_58.sh[(ulong)((uint)uVar29 & 1) + 9] =
         (shellface)((long)stbondtbl[(int)uVar18][uVar29] | (ulong)pppdVar22);
    uVar23 = *(ulong *)((long)pppdVar22 + uVar23);
    uVar29 = uVar23 & 0xfffffffffffffff0;
    uVar18 = fsymtbl[(int)uVar18][(uint)uVar23 & 0xf];
    lVar11 = *(long *)(uVar29 + 0x48);
    if (lVar11 == 0) {
      pvVar16 = memorypool::alloc(this->tet2subpool);
      *(void **)(uVar29 + 0x48) = pvVar16;
      lVar11 = 0;
      do {
        *(undefined8 *)(*(long *)(uVar29 + 0x48) + lVar11 * 8) = 0;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar11 = *(long *)(uVar29 + 0x48);
    }
    uVar8 = local_40;
    *(ulong *)(lVar11 + (ulong)(uVar18 & 3) * 8) =
         (long)tsbondtbl[(int)uVar18][uVar21] | (ulong)pppdVar7;
    pppdVar7[(ulong)(iVar19 & 1) + 9] = (shellface)(uVar29 | (long)stbondtbl[(int)uVar18][uVar21]);
    uVar25 = esymtbl[(int)uVar25];
    uVar21 = (ulong)(int)local_40;
    ppdVar13 = pppdVar12[9];
    if (ppdVar13 == (tetrahedron)0x0) {
      ppdVar13 = (tetrahedron)memorypool::alloc(this->tet2subpool);
      pppdVar12[9] = ppdVar13;
      lVar11 = 0;
      do {
        pppdVar12[9][lVar11] = (double *)0x0;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      ppdVar13 = pppdVar12[9];
    }
    else if ((double *)0x7 < ppdVar13[uVar25 & 3]) {
LAB_0011e86e:
      puVar17 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar17 = 2;
      __cxa_throw(puVar17,&int::typeinfo,0);
    }
    uVar29 = local_48;
    uVar24 = uVar21 ^ 1;
    uVar23 = (ulong)((uVar25 & 3) << 3);
    *(ulong *)((long)ppdVar13 + uVar23) = (long)tsbondtbl[(int)uVar25][uVar24] | local_48;
    *(ulong *)(local_48 + 0x48 + (ulong)((uint)uVar24 & 1) * 8) =
         (long)stbondtbl[(int)uVar25][uVar24] | (ulong)pppdVar12;
    uVar23 = *(ulong *)((long)pppdVar12 + uVar23);
    uVar24 = uVar23 & 0xfffffffffffffff0;
    uVar25 = fsymtbl[(int)uVar25][(uint)uVar23 & 0xf];
    lVar11 = *(long *)(uVar24 + 0x48);
    if (lVar11 == 0) {
      pvVar16 = memorypool::alloc(this->tet2subpool);
      *(void **)(uVar24 + 0x48) = pvVar16;
      lVar11 = 0;
      do {
        *(undefined8 *)(*(long *)(uVar24 + 0x48) + lVar11 * 8) = 0;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar11 = *(long *)(uVar24 + 0x48);
    }
    *(ulong *)(lVar11 + (ulong)(uVar25 & 3) * 8) = (long)tsbondtbl[(int)uVar25][uVar21] | uVar29;
    *(ulong *)(uVar29 + 0x48 + (ulong)(uVar8 & 1) * 8) =
         uVar24 | (long)stbondtbl[(int)uVar25][uVar21];
  }
LAB_0011e9ca:
  if ((fc->chkencflag & 4) != 0) {
    enqueuetetrahedron(this,fliptets);
    enqueuetetrahedron(this,fliptets + 1);
  }
  pppdVar22 = fliptets->tet;
  iVar10 = this->point2simindex;
  ppdVar1[iVar10] = (double *)pppdVar22;
  p3[iVar10] = (double *)pppdVar22;
  pppdVar22 = fliptets->tet;
  local_128[iVar10] = (double *)pppdVar22;
  local_130[iVar10] = (double *)pppdVar22;
  ptVar4 = (tetgenio *)fliptets[1].tet;
  (&p0->in)[iVar10] = ptVar4;
  if ((uStack_120._4_1_ & 0 < hullflag) == 0) {
    iVar10 = fliptets->ver;
  }
  else if (bVar5) {
    pppdVar22 = fliptets->tet;
    iVar19 = fliptets->ver;
    fliptets->tet = (tetrahedron *)ptVar4;
    iVar10 = fliptets[1].ver;
    fliptets->ver = iVar10;
    fliptets[1].tet = pppdVar22;
    fliptets[1].ver = iVar19;
  }
  else {
    if (bVar6) {
      iVar10 = eprevtbl[fliptets->ver];
      fliptets->ver = iVar10;
      iVar19 = enexttbl[fliptets[1].ver];
    }
    else {
      iVar10 = enexttbl[fliptets->ver];
      fliptets->ver = iVar10;
      iVar19 = eprevtbl[fliptets[1].ver];
    }
    fliptets[1].ver = iVar19;
  }
  local_140.tet = fliptets->tet;
  if (0 < fc->enqflag) {
    local_140.ver = enextesymtbl[iVar10];
    fstack = &this->flipstack;
    flippush(this,fstack,&local_140);
    local_140.tet = fliptets[1].tet;
    local_140.ver = eprevesymtbl[fliptets[1].ver];
    flippush(this,fstack,&local_140);
    local_140.tet = fliptets->tet;
    iVar10 = fliptets->ver;
    if (1 < fc->enqflag) {
      local_140.ver = eprevesymtbl[iVar10];
      flippush(this,fstack,&local_140);
      local_140.tet = fliptets[1].tet;
      local_140.ver = enextesymtbl[fliptets[1].ver];
      flippush(this,fstack,&local_140);
      local_140.tet = fliptets->tet;
      local_140.ver = esymtbl[fliptets->ver];
      flippush(this,fstack,&local_140);
      local_140.tet = fliptets[1].tet;
      local_140.ver = esymtbl[fliptets[1].ver];
      flippush(this,fstack,&local_140);
      local_140.tet = fliptets->tet;
      iVar10 = fliptets->ver;
    }
  }
  (this->recenttet).tet = local_140.tet;
  (this->recenttet).ver = iVar10;
  return;
}

Assistant:

void tetgenmesh::flip32(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastets[3];
  triface newface, casface;
  face flipshs[3]; 
  face checkseg; 
  point pa, pb, pc, pd, pe;
  REAL attrib, volume;
  int dummyflag = 0;  // Rangle = {-1, 0, 1, 2}
  int spivot = -1, scount = 0; // for flip22()
  int t1ver; 
  int i, j;

  if (hullflag > 0) {
    // Check if e is 'dummypoint'.
    if (org(fliptets[0]) == dummypoint) {
      // Reverse the edge.
      for (i = 0; i < 3; i++) {
        esymself(fliptets[i]);
      }
      // Swap the last two tets.
      newface = fliptets[1];
      fliptets[1] = fliptets[2];
      fliptets[2] = newface;
      dummyflag = -1; // e is dummypoint.
    } else {
      // Check if a or b is the 'dummypoint'.
      if (apex(fliptets[0]) == dummypoint) { 
        dummyflag = 1;  // a is dummypoint.
        newface = fliptets[0];
        fliptets[0] = fliptets[1];
        fliptets[1] = fliptets[2];
        fliptets[2] = newface;
      } else if (apex(fliptets[1]) == dummypoint) {
        dummyflag = 2;  // b is dummypoint.
        newface = fliptets[0];
        fliptets[0] = fliptets[2];
        fliptets[2] = fliptets[1];
        fliptets[1] = newface;
      } else {
        dummyflag = 0;  // either c or d may be dummypoint.
      }
    }
  }

  pa = apex(fliptets[0]);
  pb = apex(fliptets[1]);
  pc = apex(fliptets[2]);
  pd = dest(fliptets[0]);
  pe = org(fliptets[0]);

  flip32count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    eorgoppo(fliptets[i], casface);
    fsym(casface, topcastets[i]);
  }
  for (i = 0; i < 3; i++) {
    edestoppo(fliptets[i], casface);
    fsym(casface, botcastets[i]);
  }

  if (checksubfaceflag) {
    // Check if there are interior subfaces at the edge [e,d].
    for (i = 0; i < 3; i++) {
      tspivot(fliptets[i], flipshs[i]);
      if (flipshs[i].sh != NULL) {
        // Found an interior subface.
        stdissolve(flipshs[i]); // Disconnect the sub-tet bond.
        scount++;
      } else {
        spivot = i;
      }
    }
  }

  // Re-use fliptets[0] and fliptets[1].
  fliptets[0].ver = 11;
  fliptets[1].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clear all flags.
  setelemmarker(fliptets[1].tet, 0);
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
    if (fliptets[1].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[1].tet[8]);
      fliptets[1].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
    if (fliptets[1].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[1].tet[9]);
      fliptets[1].tet[9] = NULL;
    }
  }
  if (checksubfaceflag) {
    if (scount > 0) {
      // The element attributes and volume constraint must be set correctly.
      // There are two subfaces involved in this flip. The three tets are
      //   separated into two different regions, one may be exterior. The
      //   first region has two tets, and the second region has only one.
      //   The two created tets must be in the same region as the first region. 
      //   The element attributes and volume constraint must be set correctly.
      //assert(spivot != -1);
      // The tet fliptets[spivot] is in the first region.
      for (j = 0; j < 2; j++) {
        for (i = 0; i < numelemattrib; i++) {
          attrib = elemattribute(fliptets[spivot].tet, i);
          setelemattribute(fliptets[j].tet, i, attrib);
        }
        if (b->varvolume) {
          volume = volumebound(fliptets[spivot].tet);
          setvolumebound(fliptets[j].tet, volume);
        }
      }
    }
  }
  // Delete an old tet.
  tetrahedrondealloc(fliptets[2].tet);

  if (hullflag > 0) {
    // Check if c is dummypointc.
    if (pc != dummypoint) {
      // Check if d is dummypoint.
      if (pd != dummypoint) {
        // No hull tet is involved.
      } else {
        // We deleted three hull tets, and created one hull tet.
        hullsize -= 2;
      }
      setvertices(fliptets[0], pa, pb, pc, pd);
      setvertices(fliptets[1], pb, pa, pc, pe);
    } else {
      // c is dummypoint. The two new tets are hull tets.
      setvertices(fliptets[0], pb, pa, pd, pc);
      setvertices(fliptets[1], pa, pb, pe, pc);
      // Adjust badc -> abcd.
      esymself(fliptets[0]);
      // Adjust abec -> bace.
      esymself(fliptets[1]);
      // The hullsize does not change.
    }
  } else {
    setvertices(fliptets[0], pa, pb, pc, pd);
    setvertices(fliptets[1], pb, pa, pc, pe);
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[3], volpos[2], vol_diff;
    if (pc != dummypoint) {
      if (pd != dummypoint) {
        volneg[0] = tetprismvol(pe, pd, pa, pb);
        volneg[1] = tetprismvol(pe, pd, pb, pc);
        volneg[2] = tetprismvol(pe, pd, pc, pa);
        volpos[0] = tetprismvol(pa, pb, pc, pd);
        volpos[1] = tetprismvol(pb, pa, pc, pe);
      } else { // pd == dummypoint
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = 0.;
        volpos[0] = 0.;
        volpos[1] = tetprismvol(pb, pa, pc, pe);
      }
    } else { // pc == dummypoint.
      volneg[0] = tetprismvol(pe, pd, pa, pb);
      volneg[1] = 0.;
      volneg[2] = 0.;
      volpos[0] = 0.;
      volpos[1] = 0.;
    }
    vol_diff = volpos[0] + volpos[1] - volneg[0] - volneg[1] - volneg[2];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond abcd <==> bace.
  bond(fliptets[0], fliptets[1]);
  // Bond new faces to top outer boundary faces (at abcd).
  for (i = 0; i < 3; i++) {
    esym(fliptets[0], newface);
    bond(newface, topcastets[i]);
    enextself(fliptets[0]);
  }
  // Bond new faces to bottom outer boundary faces (at bace).
  for (i = 0; i < 3; i++) {
    esym(fliptets[1], newface);
    bond(newface, botcastets[i]);
    eprevself(fliptets[1]);
  }

  if (checksubsegflag) {
    // Bond 9 segments to new (flipped) tets.
    for (i = 0; i < 3; i++) { // edges a->b, b->c, c->a.      
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg);
        tssbond1(fliptets[0], checkseg);
        sstbond1(checkseg, fliptets[0]);
        tssbond1(fliptets[1], checkseg);
        sstbond1(checkseg, fliptets[1]);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
      eprevself(fliptets[1]);
    }
    // The three top edges.
    for (i = 0; i < 3; i++) { // edges b->d, c->d, a->d.
      esym(fliptets[0], newface);
      eprevself(newface); 
      enext(topcastets[i], casface);      
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
    // The three bot edges.
    for (i = 0; i < 3; i++) { // edges b<-e, c<-e, a<-e.
      esym(fliptets[1], newface);
      enextself(newface); 
      eprev(botcastets[i], casface);
      if (issubseg(casface)) {
        tsspivot1(casface, checkseg);
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      eprevself(fliptets[1]);
    }
  } // if (checksubsegflag)

  if (checksubfaceflag) {
    face checksh;
    // Bond the top three casing subfaces.
    for (i = 0; i < 3; i++) { // At edges [b,a], [c,b], [a,c]
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh);
        esym(fliptets[0], newface); 
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      enextself(fliptets[0]);
    }
    // Bond the bottom three casing subfaces.
    for (i = 0; i < 3; i++) { // At edges [a,b], [b,c], [c,a]
      if (issubface(botcastets[i])) {
        tspivot(botcastets[i], checksh);
        esym(fliptets[1], newface); 
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      eprevself(fliptets[1]);
    }

    if (scount > 0) {
      face flipfaces[2];
      // Perform a 2-to-2 flip in subfaces.
      flipfaces[0] = flipshs[(spivot + 1) % 3];
      flipfaces[1] = flipshs[(spivot + 2) % 3];
      sesymself(flipfaces[1]);
      flip22(flipfaces, 0, fc->chkencflag);
      // Connect the flipped subfaces to flipped tets.
      // First go to the corresponding flipping edge.
      //   Re-use top- and botcastets[0].
      topcastets[0] = fliptets[0];
      botcastets[0] = fliptets[1];
      for (i = 0; i < ((spivot + 1) % 3); i++) {
        enextself(topcastets[0]);
        eprevself(botcastets[0]);
      }
      // Connect the top subface to the top tets.
      esymself(topcastets[0]);
      sesymself(flipfaces[0]);
      // Check if there already exists a subface.
      tspivot(topcastets[0], checksh);
      if (checksh.sh == NULL) {
        tsbond(topcastets[0], flipfaces[0]);
        fsymself(topcastets[0]);
        sesymself(flipfaces[0]);
        tsbond(topcastets[0], flipfaces[0]);
      } else {
        // An invalid 2-to-2 flip. Report a bug.
        terminatetetgen(this, 2); 
      }
      // Connect the bot subface to the bottom tets.
      esymself(botcastets[0]);
      sesymself(flipfaces[1]);
      // Check if there already exists a subface.
      tspivot(botcastets[0], checksh);
      if (checksh.sh == NULL) {
        tsbond(botcastets[0], flipfaces[1]);
        fsymself(botcastets[0]);
        sesymself(flipfaces[1]);
        tsbond(botcastets[0], flipfaces[1]);
      } else {
        // An invalid 2-to-2 flip. Report a bug.
        terminatetetgen(this, 2);  
      }
    } // if (scount > 0)
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    // Put two new tets into check list.
    for (i = 0; i < 2; i++) {
      enqueuetetrahedron(&(fliptets[i]));
    }
  }

  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pe, (tetrahedron) fliptets[1].tet);

  if (hullflag > 0) {
    if (dummyflag != 0) {
      // Restore the original position of the points (for flipnm()).
      if (dummyflag == -1) {
        // e were dummypoint. Swap the two new tets.
        newface = fliptets[0];
        fliptets[0] = fliptets[1];
        fliptets[1] = newface;
      } else {
        // a or b was dummypoint.
        if (dummyflag == 1) {
          eprevself(fliptets[0]);
          enextself(fliptets[1]);
        } else { // dummyflag == 2
          enextself(fliptets[0]);
          eprevself(fliptets[1]);
        }
      }
    }
  }
  
  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.
    // pa = org(fliptets[0]); // 'a' may be a new vertex.
    enextesym(fliptets[0], newface);
    flippush(flipstack, &newface);
    eprevesym(fliptets[1], newface);
    flippush(flipstack, &newface);
    if (fc->enqflag > 1) {
      //pb = dest(fliptets[0]);
      eprevesym(fliptets[0], newface);
      flippush(flipstack, &newface);
      enextesym(fliptets[1], newface);
      flippush(flipstack, &newface);
      //pc = apex(fliptets[0]);
      esym(fliptets[0], newface);
      flippush(flipstack, &newface);
      esym(fliptets[1], newface);
      flippush(flipstack, &newface);
    }
  }

  recenttet = fliptets[0];
}